

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

int uripMatch(char *URI)

{
  int iVar1;
  char *URI_local;
  
  if ((URI != (char *)0x0) && (iVar1 = strcmp(URI,"file:///usr/local/etc/xml/catalog"), iVar1 != 0))
  {
    iVar1 = strcmp(urip_rcvsURLs[urip_current],URI);
    if (iVar1 != 0) {
      urip_success = 0;
    }
    return 1;
  }
  return 0;
}

Assistant:

static int
uripMatch(const char * URI) {
#ifdef LIBXML_CATALOG_ENABLED
    if ((URI == NULL) ||
        (!strcmp(URI, "file://" XML_SYSCONFDIR "/xml/catalog")))
        return(0);
#endif
    /* Verify we received the escaped URL */
    if (strcmp(urip_rcvsURLs[urip_current], URI))
	urip_success = 0;
    return(1);
}